

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O0

bool helics::checkUnitMatch(string *unit1,string *unit2,bool strict_match)

{
  precise_unit start;
  bool bVar1;
  __type _Var2;
  int iVar3;
  precise_unit *utest;
  byte in_DL;
  double dVar4;
  precise_unit pVar5;
  double conv;
  double conv_1;
  precise_unit u2;
  precise_unit u1;
  precise_unit *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff50;
  bool local_1;
  
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x50d8ef);
  if ((((bVar1) ||
       (_Var2 = std::operator==(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28), _Var2)) ||
      (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08), bVar1))
     || (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08),
        bVar1)) {
    local_1 = true;
  }
  else {
    bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x50d958);
    if (((bVar1) ||
        (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08),
        bVar1)) ||
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08), bVar1
       )) {
      local_1 = true;
    }
    else {
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      ::units::getDefaultFlags();
      ::units::unit_from_string(in_stack_ffffffffffffff50,(uint64_t)in_stack_ffffffffffffff48);
      std::__cxx11::string::~string(in_stack_ffffffffffffff10);
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      utest = (precise_unit *)::units::getDefaultFlags();
      pVar5 = ::units::unit_from_string
                        (in_stack_ffffffffffffff50,(uint64_t)in_stack_ffffffffffffff48);
      std::__cxx11::string::~string(pVar5._8_8_);
      bVar1 = ::units::is_valid(utest);
      if (bVar1) {
        bVar1 = ::units::is_valid(utest);
        if (bVar1) {
          if ((in_DL & 1) != 0) {
            start._8_8_ = utest;
            start.multiplier_ = pVar5.multiplier_;
            pVar5._8_8_ = pVar5._8_8_;
            pVar5.multiplier_ = (double)in_stack_ffffffffffffff08;
            dVar4 = ::units::quick_convert<units::precise_unit,units::precise_unit>(start,pVar5);
            iVar3 = std::isnan(dVar4);
            return (bool)(((byte)iVar3 ^ 0xff) & 1);
          }
          dVar4 = ::units::convert<units::precise_unit,units::precise_unit>
                            (pVar5._8_8_,in_stack_ffffffffffffff08);
          iVar3 = std::isnan(dVar4);
          return (bool)(((byte)iVar3 ^ 0xff) & 1);
        }
      }
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool checkUnitMatch(const std::string& unit1, const std::string& unit2, bool strict_match)
{
    if ((unit1.empty()) || (unit1 == unit2) || (unit1 == "def") || (unit1 == "any")) {
        return true;
    }

    if ((unit2.empty()) || (unit2 == "def") || (unit2 == "any")) {
        return true;
    }
    auto u1 = units::unit_from_string(unit1);
    auto u2 = units::unit_from_string(unit2);

    if (!units::is_valid(u1) || !units::is_valid(u2)) {
        return false;
    }
    if (strict_match) {
        double conv = units::quick_convert(u1, u2);
        return (!std::isnan(conv));
    }
    double conv = units::convert(u1, u2);
    return (!std::isnan(conv));
}